

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall QList<QMetaObject::Connection>::clear(QList<QMetaObject::Connection> *this)

{
  Data *pDVar1;
  Connection *pCVar2;
  qsizetype capacity;
  long lVar3;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<QMetaObject::Connection> local_40;
  QArrayData *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (this->d).size;
  if (lVar3 != 0) {
    pDVar1 = (this->d).d;
    if (pDVar1 == (Data *)0x0) {
      capacity = 0;
    }
    else {
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2) {
        pCVar2 = (this->d).ptr;
        lVar3 = lVar3 << 3;
        do {
          QMetaObject::Connection::~Connection(pCVar2);
          pCVar2 = pCVar2 + 1;
          lVar3 = lVar3 + -8;
        } while (lVar3 != 0);
        (this->d).size = 0;
        goto LAB_0048f40e;
      }
      capacity = (pDVar1->super_QArrayData).alloc;
    }
    local_40.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_40.ptr = (Connection *)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pCVar2 = (Connection *)QArrayData::allocate(&local_28,8,0x10,capacity,KeepSize);
    local_40.d = (this->d).d;
    (this->d).d = (Data *)local_28;
    local_40.ptr = (this->d).ptr;
    (this->d).ptr = pCVar2;
    local_40.size = (this->d).size;
    (this->d).size = 0;
    QArrayDataPointer<QMetaObject::Connection>::~QArrayDataPointer(&local_40);
  }
LAB_0048f40e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }